

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_n_Test::~PhPacker_Arg_n_Test(PhPacker_Arg_n_Test *this)

{
  PhPacker_Arg_n_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(PhPacker, Arg_n)
{
   auto s = PhPacker::pack('n', uint16_t{123});
   uint16_t res = std::any_cast<uint16_t>(PhPacker::unpack('n', s));
   EXPECT_EQ(res, 123);

   std::string str = PhPacker::pack('n', uint16_t{65535});
   uint16_t result = std::any_cast<uint16_t>(PhPacker::unpack('n', str));
   uint16_t expected = 65535;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint16_t>('n', std::numeric_limits<uint16_t>::max());
   result = std::any_cast<uint16_t>(PhPacker::unpack('n', str));
   expected = std::numeric_limits<uint16_t>::max();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<uint16_t>('n', std::numeric_limits<uint16_t>::min());
   result = std::any_cast<uint16_t>(PhPacker::unpack('n', str));
   expected = std::numeric_limits<uint16_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}